

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_mul_mat(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  int64_t ne [4];
  int64_t local_38;
  int64_t local_30;
  long local_28;
  long local_20;
  
  if (((a->ne[0] == b->ne[0]) && (local_28 = b->ne[2], local_28 % a->ne[2] == 0)) &&
     (local_20 = b->ne[3], local_20 % a->ne[3] == 0)) {
    if (a->nb[0] <= a->nb[1]) {
      local_38 = a->ne[1];
      local_30 = b->ne[1];
      pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_38,(ggml_tensor *)0x0,0);
      pgVar1->op = GGML_OP_MUL_MAT;
      pgVar1->src[0] = a;
      pgVar1->src[1] = b;
      return pgVar1;
    }
    pcVar2 = "!ggml_is_transposed(a)";
    line = 0xab8;
  }
  else {
    pcVar2 = "ggml_can_mul_mat(a, b)";
    line = 0xab7;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_mul_mat(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_can_mul_mat(a, b));
    GGML_ASSERT(!ggml_is_transposed(a));

    const int64_t ne[4] = { a->ne[1], b->ne[1], b->ne[2], b->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_MUL_MAT;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}